

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  long lVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint uVar5;
  int iVar6;
  Incrblob *p;
  Vdbe *pVVar7;
  char *in_RCX;
  undefined8 in_RDX;
  char *pcVar8;
  sqlite3 *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  undefined8 *in_stack_00000008;
  VdbeOp *aOp;
  int iDb;
  Vdbe *v;
  int j_1;
  int j;
  FKey *pFKey;
  Index *pIdx;
  char *zFault;
  Incrblob *pBlob;
  Table *pTab;
  int rc;
  int iCol;
  int nAttempt;
  char *zErr;
  Parse sParse;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  sqlite3 *in_stack_fffffffffffffdc0;
  Parse *in_stack_fffffffffffffdc8;
  VdbeOpList *aOp_00;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  Vdbe *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  u32 in_stack_fffffffffffffde4;
  Parse *in_stack_fffffffffffffde8;
  FKey *pFVar9;
  char **in_stack_fffffffffffffdf0;
  Index *pIVar10;
  sqlite3_int64 in_stack_fffffffffffffdf8;
  Table *local_1f8;
  uint local_1f0;
  int local_1ec;
  int local_1e8;
  char *local_1b8;
  undefined1 local_1b0 [8];
  char *local_1a8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e8 = 0;
  local_1f0 = 0;
  memset(local_1b0,0xaa,0x1a8);
  *in_stack_00000008 = 0;
  uVar5 = (uint)(in_R9D != 0);
  sqlite3_mutex_enter((sqlite3_mutex *)0x142760);
  p = (Incrblob *)
      sqlite3DbMallocZero(in_stack_fffffffffffffdc0,
                          CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  do {
    local_1b8 = (char *)0x0;
    sqlite3ParseObjectInit
              ((Parse *)in_stack_fffffffffffffdc0,
               (sqlite3 *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    if (p == (Incrblob *)0x0) {
LAB_00142e43:
      if ((local_1f0 == 0) && (in_RDI->mallocFailed == '\0')) {
        *in_stack_00000008 = p;
      }
      else {
        if ((p != (Incrblob *)0x0) && (p->pStmt != (sqlite3_stmt *)0x0)) {
          sqlite3VdbeFinalize((Vdbe *)in_stack_fffffffffffffdc0);
        }
        sqlite3DbFree(in_stack_fffffffffffffdc0,
                      (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      }
      pcVar8 = "%s";
      if (local_1b8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_1f0,pcVar8);
      sqlite3DbFree(in_stack_fffffffffffffdc0,
                    (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      sqlite3ParseObjectReset
                ((Parse *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      iVar6 = sqlite3ApiExit((sqlite3 *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0);
      sqlite3_mutex_leave((sqlite3_mutex *)0x142f12);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return iVar6;
    }
    sqlite3DbFree(in_stack_fffffffffffffdc0,
                  (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_1b8 = (char *)0x0;
    sqlite3BtreeEnterAll((sqlite3 *)0x1427c7);
    local_1f8 = sqlite3LocateTable(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                                   (char *)in_stack_fffffffffffffdd8,
                                   (char *)CONCAT44(in_stack_fffffffffffffdd4,
                                                    in_stack_fffffffffffffdd0));
    if ((local_1f8 != (Table *)0x0) && (local_1f8->eTabType == '\x01')) {
      local_1f8 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1b0,"cannot open virtual table: %s",in_RDX);
    }
    if ((local_1f8 != (Table *)0x0) && ((local_1f8->tabFlags & 0x80) != 0)) {
      local_1f8 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1b0,"cannot open table without rowid: %s",in_RDX);
    }
    if ((local_1f8 != (Table *)0x0) && ((local_1f8->tabFlags & 0x60) != 0)) {
      local_1f8 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1b0,"cannot open table with generated columns: %s",in_RDX);
    }
    if ((local_1f8 != (Table *)0x0) && (local_1f8->eTabType == '\x02')) {
      local_1f8 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1b0,"cannot open view: %s",in_RDX);
    }
    if (local_1f8 == (Table *)0x0) {
      if (local_1a8 != (char *)0x0) {
        sqlite3DbFree(in_stack_fffffffffffffdc0,
                      (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        local_1b8 = local_1a8;
        local_1a8 = (char *)0x0;
      }
      local_1f0 = 1;
      sqlite3BtreeLeaveAll((sqlite3 *)0x14292f);
      goto LAB_00142e43;
    }
    p->pTab = local_1f8;
    in_stack_fffffffffffffdc0 = (sqlite3 *)in_RDI->aDb;
    iVar6 = sqlite3SchemaToIndex(in_RDI,local_1f8->pSchema);
    p->zDb = (char *)(&in_stack_fffffffffffffdc0->pVfs)[(long)iVar6 * 4];
    local_1ec = 0;
    while ((local_1b8 = (char *)0x0, local_1ec < local_1f8->nCol &&
           (iVar6 = sqlite3StrICmp(local_1f8->aCol[local_1ec].zCnName,in_RCX), iVar6 != 0))) {
      local_1ec = local_1ec + 1;
    }
    if (local_1ec == local_1f8->nCol) {
      sqlite3DbFree(in_stack_fffffffffffffdc0,
                    (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_1b8 = sqlite3MPrintf(in_RDI,"no such column: \"%s\"",in_RCX);
      local_1f0 = 1;
      sqlite3BtreeLeaveAll((sqlite3 *)0x142a35);
      goto LAB_00142e43;
    }
    if (uVar5 != 0) {
      pcVar8 = (char *)0x0;
      if ((in_RDI->flags & 0x4000) != 0) {
        for (pFVar9 = (local_1f8->u).tab.pFKey; pFVar9 != (FKey *)0x0; pFVar9 = pFVar9->pNextFrom) {
          for (in_stack_fffffffffffffde4 = 0; (int)in_stack_fffffffffffffde4 < pFVar9->nCol;
              in_stack_fffffffffffffde4 = in_stack_fffffffffffffde4 + 1) {
            if (pFVar9->aCol[(int)in_stack_fffffffffffffde4].iFrom == local_1ec) {
              pcVar8 = "foreign key";
            }
          }
        }
        in_stack_fffffffffffffde8 = (Parse *)0x0;
      }
      for (pIVar10 = local_1f8->pIndex; pIVar10 != (Index *)0x0; pIVar10 = pIVar10->pNext) {
        for (in_stack_fffffffffffffde0 = 0; in_stack_fffffffffffffde0 < (int)(uint)pIVar10->nKeyCol;
            in_stack_fffffffffffffde0 = in_stack_fffffffffffffde0 + 1) {
          if ((pIVar10->aiColumn[in_stack_fffffffffffffde0] == local_1ec) ||
             (pIVar10->aiColumn[in_stack_fffffffffffffde0] == -2)) {
            pcVar8 = "indexed";
          }
        }
      }
      if (pcVar8 != (char *)0x0) {
        sqlite3DbFree(in_stack_fffffffffffffdc0,
                      (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        local_1b8 = sqlite3MPrintf(in_RDI,"cannot open %s column for writing",pcVar8);
        local_1f0 = 1;
        sqlite3BtreeLeaveAll((sqlite3 *)0x142bf7);
        goto LAB_00142e43;
      }
      in_stack_fffffffffffffdf0 = (char **)0x0;
      in_stack_fffffffffffffdf8 = 0;
    }
    pVVar7 = sqlite3VdbeCreate(in_stack_fffffffffffffdc8);
    p->pStmt = (sqlite3_stmt *)pVVar7;
    if (p->pStmt != (sqlite3_stmt *)0x0) {
      in_stack_fffffffffffffdd8 = (Vdbe *)p->pStmt;
      in_stack_fffffffffffffdd4 = sqlite3SchemaToIndex(in_RDI,local_1f8->pSchema);
      aOp_00 = (VdbeOpList *)&DAT_aaaaaaaaaaaaaaaa;
      sqlite3VdbeAddOp4Int
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,
                 -0x55555556,-0x55555556,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      sqlite3VdbeChangeP5(in_stack_fffffffffffffdd8,1);
      in_stack_fffffffffffffdc8 =
           (Parse *)sqlite3VdbeAddOpList
                              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,aOp_00,
                               (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      sqlite3VdbeUsesBtree((Vdbe *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      if (in_RDI->mallocFailed == '\0') {
        *(int *)((long)&in_stack_fffffffffffffdc8->db + 4) = in_stack_fffffffffffffdd4;
        *(Pgno *)&in_stack_fffffffffffffdc8->zErrMsg = local_1f8->tnum;
        *(uint *)((long)&in_stack_fffffffffffffdc8->zErrMsg + 4) = uVar5;
        sqlite3VdbeChangeP4((Vdbe *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                            (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
      }
      if (in_RDI->mallocFailed == '\0') {
        if (uVar5 != 0) {
          *(undefined1 *)&in_stack_fffffffffffffdc8->rc = 0x71;
        }
        uVar2 = *(undefined1 *)((long)&local_1f8->tnum + 1);
        uVar3 = *(undefined1 *)((long)&local_1f8->tnum + 2);
        uVar4 = *(undefined1 *)((long)&local_1f8->tnum + 3);
        in_stack_fffffffffffffdc8->isMultiWrite = *(undefined1 *)&local_1f8->tnum;
        in_stack_fffffffffffffdc8->mayAbort = uVar2;
        in_stack_fffffffffffffdc8->hasCompound = uVar3;
        in_stack_fffffffffffffdc8->okConstFactor = uVar4;
        in_stack_fffffffffffffdc8->disableLookaside = (char)in_stack_fffffffffffffdd4;
        in_stack_fffffffffffffdc8->prepFlags = (char)((uint)in_stack_fffffffffffffdd4 >> 8);
        in_stack_fffffffffffffdc8->withinRJSubrtn = (char)((uint)in_stack_fffffffffffffdd4 >> 0x10);
        in_stack_fffffffffffffdc8->bHasWith = (char)((uint)in_stack_fffffffffffffdd4 >> 0x18);
        *(undefined1 *)((long)&in_stack_fffffffffffffdc8->rc + 1) = 0xfd;
        *(int *)&in_stack_fffffffffffffdc8->mSubrtnSig = local_1f8->nCol + 1;
        *(int *)&in_stack_fffffffffffffdc8->aLabel = (int)local_1f8->nCol;
        sqlite3VdbeMakeReady
                  (in_stack_fffffffffffffdd8,
                   (Parse *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      }
    }
    p->iCol = (u16)local_1ec;
    p->db = in_RDI;
    sqlite3BtreeLeaveAll((sqlite3 *)0x142deb);
    if (in_RDI->mallocFailed != '\0') goto LAB_00142e43;
    local_1f0 = blobSeekToRow(p,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_1e8 = local_1e8 + 1;
    if ((0x31 < local_1e8) || (local_1f0 != 0x11)) goto LAB_00142e43;
    sqlite3ParseObjectReset((Parse *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 || zColumn==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  while(1){
    sqlite3ParseObjectInit(&sParse,db);
    if( !pBlob ) goto blob_open_out;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
    if( pTab && (pTab->tabFlags&TF_HasGenerated)!=0 ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table with generated columns: %s",
                      zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && IsView(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zCnName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key.
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this
        ** case.  */
        FKey *pFKey;
        assert( IsOrdinaryTable(pTab) );
        for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){

      /* This VDBE program seeks a btree cursor to the identified
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag,
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb);

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }

    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
    if( (++nAttempt)>=SQLITE_MAX_SCHEMA_RETRY || rc!=SQLITE_SCHEMA ) break;
    sqlite3ParseObjectReset(&sParse);
  }

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParseObjectReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}